

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O0

void __thiscall CTcParser::parse_property(CTcParser *this,int *err)

{
  bool bVar1;
  tc_toktyp_t tVar2;
  int done;
  int in_stack_ffffffffffffffcc;
  CTcTokenizer **in_stack_ffffffffffffffd0;
  tc_toktyp_t in_stack_ffffffffffffffd8;
  tc_toktyp_t in_stack_ffffffffffffffdc;
  
  CTcTokenizer::next((CTcTokenizer *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  bVar1 = false;
  while( true ) {
    while( true ) {
      while( true ) {
        if (bVar1) {
          return;
        }
        tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x217f91);
        if (tVar2 == TOKT_SYM) break;
        in_stack_ffffffffffffffd0 = &G_tok;
        CTcTokenizer::log_error_curtok((CTcTokenizer *)&G_tok,in_stack_ffffffffffffffcc);
        in_stack_ffffffffffffffd8 = CTcTokenizer::cur((CTcTokenizer *)0x218118);
        if (in_stack_ffffffffffffffd8 == TOKT_EOF) {
          return;
        }
        if (in_stack_ffffffffffffffd8 == TOKT_COMMA) {
          CTcTokenizer::next((CTcTokenizer *)CONCAT44(in_stack_ffffffffffffffdc,0x15));
        }
        else {
          if (in_stack_ffffffffffffffd8 - TOKT_LBRACE < 2) {
            return;
          }
          if (in_stack_ffffffffffffffd8 == TOKT_SEM) {
            return;
          }
          CTcTokenizer::next((CTcTokenizer *)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
          tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x21817a);
          if (tVar2 == TOKT_COMMA) {
            CTcTokenizer::next((CTcTokenizer *)
                               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
          }
        }
        tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x21819f);
        if (tVar2 == TOKT_SEM) {
          CTcTokenizer::next((CTcTokenizer *)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
          return;
        }
      }
      CTcTokenizer::getcur(G_tok);
      look_up_prop(this,(CTcToken *)err,done);
      tVar2 = CTcTokenizer::next((CTcTokenizer *)
                                 CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      if (tVar2 != TOKT_COMMA) break;
      CTcTokenizer::next((CTcTokenizer *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    }
    tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x217ff2);
    if (tVar2 == TOKT_SEM) {
      CTcTokenizer::next((CTcTokenizer *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      return;
    }
    in_stack_ffffffffffffffdc = CTcTokenizer::cur((CTcTokenizer *)0x21801a);
    if (in_stack_ffffffffffffffdc == TOKT_EOF) break;
    if (in_stack_ffffffffffffffdc == TOKT_SYM) {
      CTcTokenizer::log_error_curtok
                ((CTcTokenizer *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    }
    else {
      if (in_stack_ffffffffffffffdc - TOKT_LBRACE < 2) break;
      CTcTokenizer::log_error_curtok
                ((CTcTokenizer *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      CTcTokenizer::next((CTcTokenizer *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x2180a4);
      if (tVar2 == TOKT_COMMA) {
        CTcTokenizer::next((CTcTokenizer *)
                           CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      }
      else {
        tVar2 = CTcTokenizer::cur((CTcTokenizer *)0x2180c9);
        if (tVar2 == TOKT_SEM) {
          CTcTokenizer::next((CTcTokenizer *)
                             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
          bVar1 = true;
        }
      }
    }
  }
  CTcTokenizer::log_error_curtok
            ((CTcTokenizer *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  return;
}

Assistant:

void CTcParser::parse_property(int *err)
{
    int done;
    
    /* skip the 'property' token */
    G_tok->next();

    /* parse property names until we run out */
    for (done = FALSE ; !done ; )
    {
        /* we should be looking at a property name */
        if (G_tok->cur() == TOKT_SYM)
        {
            /* 
             *   look up the property; this will add it to the symbol table
             *   if it isn't already in there, and will generate an error if
             *   it's already defined as something other than a property 
             */
            look_up_prop(G_tok->getcur(), TRUE);
            
            /* skip the symbol and check what follows */
            if (G_tok->next() == TOKT_COMMA)
            {
                /* skip the comma and continue */
                G_tok->next();
            }
            else if (G_tok->cur() == TOKT_SEM)
            {
                /* 
                 *   end of the statement - skip the semicolon and we're
                 *   done 
                 */
                G_tok->next();
                break;
            }
            else
            {
                /* 
                 *   if it's a brace, they probably left out the semicolon;
                 *   if it's a symbol, they probably left out the comma;
                 *   otherwise, it's probably a stray token 
                 */
                switch(G_tok->cur())
                {
                case TOKT_SYM:
                    /* 
                     *   probably left out a comma - flag an error, but
                     *   proceed with parsing this new symbol 
                     */
                    G_tok->log_error_curtok(TCERR_PROPDECL_REQ_COMMA);
                    break;
                    
                case TOKT_LBRACE:
                case TOKT_RBRACE:
                case TOKT_EOF:
                    /* they probably left out the semicolon */
                    G_tok->log_error_curtok(TCERR_EXPECTED_SEMI);
                    return;
                    
                default:
                    /* log an error */
                    G_tok->log_error_curtok(TCERR_PROPDECL_REQ_COMMA);
                    
                    /* skip the errant symbol */
                    G_tok->next();
                    
                    /* 
                     *   if a comma follows, something was probably just
                     *   inserted - skip the comma; if a semicolon follows,
                     *   assume we're at the end of the statement 
                     */
                    if (G_tok->cur() == TOKT_COMMA)
                    {
                        /* 
                         *   we're probably okay again - skip the comma and
                         *   continue 
                         */
                        G_tok->next();
                    }
                    else if (G_tok->cur() == TOKT_SEM)
                    {
                        /* skip the semicolon, and we're done */
                        G_tok->next();
                        done = TRUE;
                    }
                    
                    /* proceed with what follows */
                    break;
                }
            }
        }
        else
        {
            /* log an error */
            G_tok->log_error_curtok(TCERR_PROPDECL_REQ_SYM);

            switch(G_tok->cur())
            {
            case TOKT_SEM:
            case TOKT_LBRACE:
            case TOKT_RBRACE:
            case TOKT_EOF:
                /* they're probably done with the statement */
                return;

            case TOKT_COMMA:
                /* 
                 *   they probably just doubled a comma - skip it and
                 *   continue 
                 */
                G_tok->next();
                break;
                
            default:
                /* skip this token */
                G_tok->next();
                
                /* 
                 *   if a comma follows, they probably put in a keyword or
                 *   something like that - skip the comma and continue 
                 */
                if (G_tok->cur() == TOKT_COMMA)
                    G_tok->next();
                break;
            }
            
            /* if a semicolon follows, we're done */
            if (G_tok->cur() == TOKT_SEM)
            {
                /* skip the semicolon and we're done */
                G_tok->next();
                break;
            }
        }
    }
}